

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O0

void __thiscall
helics::PotentialInterfacesManager::PotentialInterfacesManager
          (PotentialInterfacesManager *this,Core *core,Federate *fed)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  bool in_stack_ffffffffffffffbf;
  atomic<bool> *in_stack_ffffffffffffffc0;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  CLI::std::atomic<bool>::atomic(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  *(undefined1 *)((long)in_RDI + 0x11) = 1;
  std::map<$bc435079$>::map((map<_bc435079_> *)0x3e7c40);
  std::map<$bc435079$>::map((map<_bc435079_> *)0x3e7c53);
  std::
  deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::deque((deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x3e7c61);
  return;
}

Assistant:

PotentialInterfacesManager::PotentialInterfacesManager(Core* core, Federate* fed):
    corePtr(core), fedPtr(fed)
{
}